

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_stream.hpp
# Opt level: O2

basic_binary_istream<fail_flag_serialization_policy> *
detail::operator>>(istream_mixin<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
                   *stream,map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *value)

{
  basic_binary_istream<fail_flag_serialization_policy> *this;
  span<const_std::byte> buffer;
  byte *in_RAX;
  pair<unsigned_long,_bool> pVar1;
  
  this = (basic_binary_istream<fail_flag_serialization_policy> *)(stream + -0x10);
  if ((stream->
      super_stream_mixin_base<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
      ).super_fail_flag_serialization_policy.overflow == false) {
    span<const_std::byte>::size((span<const_std::byte> *)this);
    buffer.end_ = in_RAX;
    buffer.begin_ = (byte *)0x103cc2;
    pVar1 = try_get_deserialized_size<std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
                      (buffer);
    if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      (stream->
      super_stream_mixin_base<basic_binary_istream<fail_flag_serialization_policy>,_span<const_std::byte>,_fail_flag_serialization_policy>
      ).super_fail_flag_serialization_policy.overflow = true;
    }
    else {
      do_deserialize<std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
                (value,this);
    }
  }
  return this;
}

Assistant:

StreamDerived& operator>>(istream_mixin<StreamDerived, SpanBase, fail_flag_serialization_policy>& stream, T& value) {
        if (stream.overflow) return stream.base();

        auto const [_, success] = try_get_deserialized_size<T>(stream.span());
        if (!success) {
            stream.overflow = true;
            return stream.base();
        }
        deserialize(value, stream.span());
        return stream.base();
    }